

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O3

void __thiscall Maze::startCellEndCells(Maze *this)

{
  tuple<int,_int> *ptVar1;
  _Head_base<0UL,_int,_false> *p_Var2;
  tuple<int,_int> *ptVar3;
  pointer pvVar4;
  pointer pvVar5;
  char *pcVar6;
  pointer pcVar7;
  pointer pcVar8;
  pointer pcVar9;
  bool bVar10;
  _Head_base<0UL,_int,_false> *p_Var11;
  tuple<int,_int> *ptVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  _Head_base<0UL,_int,_false> *p_Var16;
  pointer *ppcVar17;
  long lVar18;
  
  pvVar4 = (this->MazeMatrix).
           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (this->MazeMatrix).
           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar14 = ((long)pvVar5 - (long)pvVar4 >> 3) * -0x5555555555555555;
  if (pvVar5 != pvVar4) {
    ptVar1 = &this->startCell;
    p_Var2 = &(this->startCell).super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>;
    ptVar3 = &this->endCell;
    p_Var16 = &(this->endCell).super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>;
    ppcVar17 = &(pvVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    lVar18 = 0;
    bVar10 = false;
    do {
      pcVar6 = ((_Vector_impl_data *)(ppcVar17 + -1))->_M_start;
      lVar13 = (long)*ppcVar17 - (long)pcVar6;
      if (lVar13 == 0) {
        uVar15 = 0;
        uVar14 = 0;
        goto LAB_00102f89;
      }
      if (*pcVar6 == '0') {
        p_Var11 = p_Var16;
        ptVar12 = ptVar3;
        if (!bVar10) {
          bVar10 = true;
          p_Var11 = p_Var2;
          ptVar12 = ptVar1;
        }
        p_Var11->_M_head_impl = (int)lVar18;
        (ptVar12->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = 0;
      }
      if (pcVar6[lVar13 + -1] == '0') {
        p_Var11 = p_Var16;
        ptVar12 = ptVar3;
        if (!bVar10) {
          bVar10 = true;
          p_Var11 = p_Var2;
          ptVar12 = ptVar1;
        }
        p_Var11->_M_head_impl = (int)lVar18;
        (ptVar12->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = (int)lVar13 + -1;
      }
      lVar18 = lVar18 + 1;
      ppcVar17 = ppcVar17 + 3;
    } while (uVar14 + (uVar14 == 0) != lVar18);
    if (pvVar5 != pvVar4) {
      pcVar7 = (pvVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar8 = (pvVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pcVar8 != pcVar7) {
        lVar18 = uVar14 - 1;
        pcVar9 = pvVar4[lVar18].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar14 = (long)pvVar4[lVar18].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pcVar9;
        uVar15 = 0;
        do {
          if (pcVar7[uVar15] == '0') {
            p_Var11 = p_Var16;
            ptVar12 = ptVar3;
            if (!bVar10) {
              bVar10 = true;
              p_Var11 = p_Var2;
              ptVar12 = ptVar1;
            }
            p_Var11->_M_head_impl = 0;
            (ptVar12->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl = (int)uVar15;
          }
          if (uVar14 <= uVar15) goto LAB_00102f89;
          if (pcVar9[uVar15] == '0') {
            p_Var11 = p_Var16;
            ptVar12 = ptVar3;
            if (!bVar10) {
              bVar10 = true;
              p_Var11 = p_Var2;
              ptVar12 = ptVar1;
            }
            p_Var11->_M_head_impl = (int)lVar18;
            (ptVar12->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl = (int)uVar15;
          }
          uVar15 = uVar15 + 1;
        } while ((long)pcVar8 - (long)pcVar7 != uVar15);
      }
      return;
    }
  }
  uVar15 = 0;
LAB_00102f89:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15,
             uVar14);
}

Assistant:

void Maze::startCellEndCells() {
//looks for the start cell and the end cell.
//scans the edges, and picks the first one it comes accoss as the start cell. The next one
// would be the ending cell.


    bool startFound = false;
    for(int i = 0; i < MazeMatrix.size(); i++)
    {
        if(MazeMatrix.at(i).at(0) == '0'){
            if(!startFound){
                startCell = std::make_tuple (i,0);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(i,0);
            }
        }
        if(MazeMatrix.at(i).at(MazeMatrix.at(i).size()-1) == '0'){
            if(!startFound){
                startCell = std::make_tuple (i,MazeMatrix.at(i).size()-1);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(i,MazeMatrix.at(i).size()-1);
            }
        }
    }
    //checking top and bottom
    for(int i = 0; i < MazeMatrix.at(0).size(); i++){
        if(MazeMatrix.at(0).at(i) == '0'){
            if(!startFound){
                startCell = std::make_tuple (0, i);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(0, i);
            }
        }
        if(MazeMatrix.at(MazeMatrix.size() -1).at(i) == '0'){
            if(!startFound){
                startCell = std::make_tuple(MazeMatrix.size()-1, i);
                startFound = true;
            }
            else {
                endCell = std::make_tuple(MazeMatrix.size() - 1, i);
            }

        }

    }
 }